

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void attach_fig_transform_timeout(obj *figurine)

{
  int iVar1;
  int i;
  obj *figurine_local;
  
  stop_timer(figurine->olev,5,figurine);
  iVar1 = rnd(9000);
  start_timer(figurine->olev,(long)(iVar1 + 200),2,5,figurine);
  return;
}

Assistant:

void attach_fig_transform_timeout(struct obj *figurine)
{
	int i;

	/* stop previous timer, if any */
	stop_timer(figurine->olev, FIG_TRANSFORM, figurine);

	/*
	 * Decide when to transform the figurine.
	 */
	i = rnd(9000) + 200;
	/* figurine will transform */
	start_timer(figurine->olev, (long)i, TIMER_OBJECT,
				FIG_TRANSFORM, figurine);
}